

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O0

bool __thiscall DMenu::MouseEventBack(DMenu *this,int type,int x,int y)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  char *texname;
  FTexture *this_00;
  bool local_41;
  FTexture *tex;
  int local_20;
  int y_local;
  int x_local;
  int type_local;
  DMenu *this_local;
  
  iVar1 = FIntCVar::operator_cast_to_int(&m_show_backbutton);
  if (-1 < iVar1) {
    texname = FString::operator_cast_to_char_(&gameinfo.mBackButton);
    this_00 = FTextureManager::operator()(&TexMan,texname);
    if (this_00 != (FTexture *)0x0) {
      uVar2 = FIntCVar::operator_cast_to_int(&m_show_backbutton);
      local_20 = x;
      if ((uVar2 & 1) != 0) {
        iVar1 = DCanvas::GetWidth((DCanvas *)screen);
        iVar3 = FTexture::GetScaledWidth(this_00);
        local_20 = x - (iVar1 - iVar3 * CleanXfac);
      }
      uVar2 = FIntCVar::operator_cast_to_int(&m_show_backbutton);
      tex._4_4_ = y;
      if ((uVar2 & 2) != 0) {
        iVar1 = DCanvas::GetHeight((DCanvas *)screen);
        iVar3 = FTexture::GetScaledHeight(this_00);
        tex._4_4_ = y - (iVar1 - iVar3 * CleanYfac);
      }
      local_41 = false;
      if (-1 < local_20) {
        iVar1 = FTexture::GetScaledWidth(this_00);
        local_41 = false;
        if ((local_20 < iVar1 * CleanXfac) && (local_41 = false, -1 < tex._4_4_)) {
          iVar1 = FTexture::GetScaledHeight(this_00);
          local_41 = tex._4_4_ < iVar1 * CleanYfac;
        }
      }
      (this->super_DObject).field_0x25 = local_41;
      if ((((this->super_DObject).field_0x25 & 1) != 0) && (type == 2)) {
        iVar1 = FIntCVar::operator_cast_to_int(&m_use_mouse);
        if (iVar1 == 2) {
          (this->super_DObject).field_0x25 = 0;
        }
        (*(this->super_DObject)._vptr_DObject[8])(this,7,1);
      }
      return (bool)((this->super_DObject).field_0x25 & 1);
    }
  }
  return false;
}

Assistant:

bool DMenu::MouseEventBack(int type, int x, int y)
{
	if (m_show_backbutton >= 0)
	{
		FTexture *tex = TexMan(gameinfo.mBackButton);
		if (tex != NULL)
		{
			if (m_show_backbutton&1) x -= screen->GetWidth() - tex->GetScaledWidth() * CleanXfac;
			if (m_show_backbutton&2) y -= screen->GetHeight() - tex->GetScaledHeight() * CleanYfac;
			mBackbuttonSelected = ( x >= 0 && x < tex->GetScaledWidth() * CleanXfac && 
									y >= 0 && y < tex->GetScaledHeight() * CleanYfac);
			if (mBackbuttonSelected && type == MOUSE_Release)
			{
				if (m_use_mouse == 2) mBackbuttonSelected = false;
				MenuEvent(MKEY_Back, true);
			}
			return mBackbuttonSelected;
		}
	}
	return false;
}